

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O0

void __thiscall
spoa::test::SpoaTest_GlobalConvexWithQualities_Test::SpoaTest_GlobalConvexWithQualities_Test
          (SpoaTest_GlobalConvexWithQualities_Test *this)

{
  SpoaTest_GlobalConvexWithQualities_Test *this_local;
  
  SpoaTest::SpoaTest(&this->super_SpoaTest);
  (this->super_SpoaTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SpoaTest_GlobalConvexWithQualities_Test_001d1398;
  return;
}

Assistant:

TEST_F(SpoaTest, GlobalConvexWithQualities) {
  Initialize(AlignmentType::kNW, 5, -4, -8, -6, -10, -2, true);
  Align();

  std::string c =
      "ATGATGCGCTTTGTTGGCGCGGTGGCTTGATGCAGGGGCTAATCGACCTCTGGCAACCACTTTTCCATGACA"
      "GGAGTTGAATATGGCATTCAGTAATCCCTTCGATGATCCGCAGGGAGCGTTTTACATATTGCGCAATGCGCA"
      "GGGGCAATTCAGTCTGTGGCCGCAACAATGCGTCTTACCGGCAGGCTGGGACATTGTGTGTCAGCCGCAGTC"
      "ACAGGCGTCCTGCCAGCAGTGGCTGGAAGCCCACTGGCGTACTCTGACACCGACGAATTTTACCCAGTTGCA"
      "GGGAGGCACAATGAGCCAGCATTTACCTTTGGTCGCCGCACAGCCCGGCATCTGGATGGCAGAAAAACTGTC"
      "AGAATTACCCTCCGCCTGGAGCGTGGCGCATTACGTTGAGTTAACCGGAGAGGTTGATTCGCCATTACTGGC"
      "CCGCGCGGTGGTTGCCGGACTAGCGCAAAGCAGATACGC";

  Check(c);
}